

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

void Jf_ManGenCnf(word uTruth,int iLitOut,Vec_Int_t *vLeaves,Vec_Int_t *vLits,Vec_Int_t *vClas,
                 Vec_Int_t *vCover)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  uint Entry;
  long lVar6;
  ulong local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  long local_38;
  
  local_50 = uTruth;
  if (1 < uTruth + 1) {
    local_40 = vClas;
    if (vLeaves->nSize < 1) {
      __assert_fail("Vec_IntSize(vLeaves) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                    ,0x8a,
                    "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    uVar1 = 0;
    bVar3 = true;
    local_48 = vCover;
    do {
      iVar4 = Kit_TruthIsop((uint *)&local_50,vLeaves->nSize,vCover,0);
      if (iVar4 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                      ,0x8e,
                      "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (0 < vCover->nSize) {
        lVar6 = 0;
        do {
          iVar4 = vCover->pArray[lVar6];
          Vec_IntPush(local_40,vLits->nSize);
          if (iLitOut < 0) goto LAB_00704595;
          local_38 = lVar6;
          Vec_IntPush(vLits,uVar1 ^ iLitOut);
          if (0 < vLeaves->nSize) {
            bVar5 = 0;
            lVar6 = 0;
            do {
              switch(iVar4 >> (bVar5 & 0x1f) & 3) {
              case 0:
                goto switchD_00704510_caseD_0;
              case 1:
                Entry = vLeaves->pArray[lVar6];
                if ((int)Entry < 0) goto LAB_00704595;
                break;
              case 2:
                if (vLeaves->pArray[lVar6] < 0) goto LAB_00704595;
                Entry = vLeaves->pArray[lVar6] ^ 1;
                break;
              case 3:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                              ,0x9b,
                              "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              Vec_IntPush(vLits,Entry);
switchD_00704510_caseD_0:
              lVar6 = lVar6 + 1;
              bVar5 = bVar5 + 2;
            } while (lVar6 < vLeaves->nSize);
          }
          lVar6 = local_38 + 1;
          vCover = local_48;
        } while (lVar6 < local_48->nSize);
      }
      local_50 = ~local_50;
      uVar1 = 1;
      bVar2 = !bVar3;
      bVar3 = false;
      if (bVar2) {
        return;
      }
    } while( true );
  }
  Vec_IntPush(vClas,vLits->nSize);
  if (-1 < iLitOut) {
    Vec_IntPush(vLits,(uint)(uTruth == 0) ^ iLitOut);
    return;
  }
LAB_00704595:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf5,"int Abc_LitNotCond(int, int)");
}

Assistant:

void Jf_ManGenCnf( word uTruth, int iLitOut, Vec_Int_t * vLeaves, Vec_Int_t * vLits, Vec_Int_t * vClas, Vec_Int_t * vCover )
{
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Vec_IntPush( vLits, Abc_LitNotCond(iLitOut, (uTruth == 0)) );
    }
    else 
    {
        int i, k, c, Literal, Cube;
        assert( Vec_IntSize(vLeaves) > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, Vec_IntSize(vLeaves), vCover, 0 );
            assert( RetValue == 0 );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                Vec_IntPush( vClas, Vec_IntSize(vLits) );
                Vec_IntPush( vLits, Abc_LitNotCond(iLitOut, c) );
                for ( k = 0; k < Vec_IntSize(vLeaves); k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_IntPush( vLits, Abc_LitNotCond(Vec_IntEntry(vLeaves, k), 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_IntPush( vLits, Abc_LitNotCond(Vec_IntEntry(vLeaves, k), 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
            }
            uTruth = ~uTruth;
        }
    }
}